

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_decoder.cpp
# Opt level: O1

bool __thiscall
duckdb::DictionaryDecoder::CanFilter
          (DictionaryDecoder *this,TableFilter *filter,TableFilterState *filter_state)

{
  bool bVar1;
  
  if (this->dictionary_size == 0) {
    return false;
  }
  bVar1 = DictionarySupportsFilter(this,filter,filter_state);
  return bVar1;
}

Assistant:

bool DictionaryDecoder::CanFilter(const TableFilter &filter, TableFilterState &filter_state) {
	if (dictionary_size == 0) {
		return false;
	}
	// We can only push the filter if the filter removes NULL values
	if (!DictionarySupportsFilter(filter, filter_state)) {
		return false;
	}
	return true;
}